

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O0

bool QOpenGLTexture::hasFeature(Feature feature)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  QByteArray *pQVar7;
  ulong uVar8;
  GLubyte *__haystack;
  char *pcVar9;
  int in_EDI;
  long in_FS_OFFSET;
  char *renderer;
  bool supported;
  QOpenGLContext *ctx;
  QSurfaceFormat f;
  undefined4 in_stack_fffffffffffff898;
  GLenum in_stack_fffffffffffff89c;
  undefined4 in_stack_fffffffffffff8a0;
  int in_stack_fffffffffffff8a4;
  char *in_stack_fffffffffffff8a8;
  undefined7 in_stack_fffffffffffff8b0;
  undefined1 in_stack_fffffffffffff8b7;
  byte bVar10;
  byte local_731;
  byte local_71a;
  byte local_6f2;
  byte local_6f1;
  byte local_6d1;
  byte local_6c1;
  byte local_6b1;
  byte local_6a1;
  byte local_691;
  byte local_679;
  byte local_669;
  byte local_659;
  byte local_649;
  bool local_611;
  bool local_601;
  int local_600 [2];
  pair<int,_int> local_5f8;
  undefined8 local_5f0;
  QArrayDataPointer<char> local_5e8 [2];
  int local_5b8 [2];
  pair<int,_int> local_5b0;
  undefined8 local_5a8;
  QArrayDataPointer<char> local_5a0 [2];
  QArrayDataPointer<char> local_570 [2];
  int local_540 [2];
  pair<int,_int> local_538;
  undefined8 local_530;
  QArrayDataPointer<char> local_528 [2];
  int local_4f8 [2];
  pair<int,_int> local_4f0;
  undefined8 local_4e8;
  int local_4e0 [2];
  pair<int,_int> local_4d8;
  undefined8 local_4d0;
  QArrayDataPointer<char> local_4c8 [2];
  int local_498 [2];
  pair<int,_int> local_490;
  undefined8 local_488;
  int local_480 [2];
  pair<int,_int> local_478;
  undefined8 local_470;
  int local_468 [2];
  pair<int,_int> local_460;
  undefined8 local_458;
  QArrayDataPointer<char> local_450 [2];
  int local_420 [2];
  pair<int,_int> local_418;
  undefined8 local_410;
  int local_408 [2];
  pair<int,_int> local_400;
  undefined8 local_3f8;
  QArrayDataPointer<char> local_3f0 [2];
  QArrayDataPointer<char> local_3c0 [2];
  int local_390 [2];
  pair<int,_int> local_388;
  undefined8 local_380;
  int local_378 [2];
  pair<int,_int> local_370;
  undefined8 local_368;
  QArrayDataPointer<char> local_360 [2];
  QArrayDataPointer<char> local_330 [2];
  int local_300 [2];
  pair<int,_int> local_2f8;
  undefined8 local_2f0;
  QArrayDataPointer<char> local_2e8 [2];
  int local_2b8 [2];
  pair<int,_int> local_2b0;
  undefined8 local_2a8;
  QArrayDataPointer<char> local_2a0 [2];
  int local_270 [2];
  pair<int,_int> local_268;
  undefined8 local_260;
  QArrayDataPointer<char> local_258 [2];
  int local_228 [2];
  pair<int,_int> local_220;
  undefined8 local_218;
  QArrayDataPointer<char> local_210 [2];
  int local_1e0 [2];
  pair<int,_int> local_1d8;
  undefined8 local_1d0;
  QArrayDataPointer<char> local_1c8 [2];
  int local_198 [2];
  pair<int,_int> local_190;
  undefined8 local_188;
  QArrayDataPointer<char> local_180 [2];
  QArrayDataPointer<char> local_150 [2];
  int local_120 [2];
  pair<int,_int> local_118;
  undefined8 local_110;
  QArrayDataPointer<char> local_108 [2];
  int local_d8 [2];
  pair<int,_int> local_d0;
  undefined8 local_c8;
  QArrayDataPointer<char> local_c0 [2];
  int local_90 [2];
  pair<int,_int> local_88;
  undefined8 local_80;
  QArrayDataPointer<char> local_78 [2];
  int local_48 [2];
  pair<int,_int> local_40;
  undefined8 local_38;
  undefined8 local_30;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = (QByteArray *)QOpenGLContext::currentContext();
  if (pQVar7 == (QByteArray *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(in_stack_fffffffffffff8b7,in_stack_fffffffffffff8b0),
               in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a4,
               (char *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
    QMessageLogger::warning
              (local_28,"QOpenGLTexture::hasFeature() requires a valid current context");
    local_601 = false;
    goto LAB_00186e51;
  }
  local_30 = 0xaaaaaaaaaaaaaaaa;
  QOpenGLContext::format();
  local_611 = false;
  uVar8 = QOpenGLContext::isOpenGLES();
  if ((uVar8 & 1) == 0) {
    if (in_EDI == 1) {
      local_110 = QSurfaceFormat::version();
      local_120[1] = 4;
      local_120[0] = 2;
      std::pair<int,_int>::pair<int,_int,_true>(&local_118,local_120 + 1,local_120);
      bVar4 = std::operator>=((pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                              (pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      bVar2 = false;
      bVar3 = false;
      bVar1 = false;
      bVar5 = false;
      local_679 = 1;
      if (!bVar4) {
        QArrayDataPointer<char>::QArrayDataPointer
                  (local_150,(Data *)0x0,"GL_ARB_texture_storage",0x16);
        bVar2 = true;
        QByteArray::QByteArray
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
        bVar3 = true;
        bVar10 = QOpenGLContext::hasExtension(pQVar7);
        local_679 = 1;
        if ((bVar10 & 1) == 0) {
          QArrayDataPointer<char>::QArrayDataPointer
                    (local_180,(Data *)0x0,"GL_EXT_texture_storage",0x16);
          bVar1 = true;
          QByteArray::QByteArray
                    ((QByteArray *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                     (DataPointer *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
          bVar5 = true;
          local_679 = QOpenGLContext::hasExtension(pQVar7);
        }
      }
      local_611 = (bool)(local_679 & 1);
      if (bVar5) {
        QByteArray::~QByteArray((QByteArray *)0x185a5a);
      }
      if (bVar1) {
        QArrayDataPointer<char>::~QArrayDataPointer
                  ((QArrayDataPointer<char> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
      }
      if (bVar3) {
        QByteArray::~QByteArray((QByteArray *)0x185a8c);
      }
      if (bVar2) {
        QArrayDataPointer<char>::~QArrayDataPointer
                  ((QArrayDataPointer<char> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
      }
    }
    else if (in_EDI == 2) {
      local_38 = QSurfaceFormat::version();
      local_48[1] = 4;
      local_48[0] = 3;
      std::pair<int,_int>::pair<int,_int,_true>(&local_40,local_48 + 1,local_48);
      bVar5 = std::operator>=((pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                              (pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      local_649 = 1;
      if (!bVar5) {
        QArrayDataPointer<char>::QArrayDataPointer
                  (local_78,(Data *)0x0,"GL_ARB_texture_storage_multisample",0x22);
        QByteArray::QByteArray
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
        local_649 = QOpenGLContext::hasExtension(pQVar7);
      }
      local_611 = (bool)(local_649 & 1);
      if (!bVar5) {
        QByteArray::~QByteArray((QByteArray *)0x185639);
        QArrayDataPointer<char>::~QArrayDataPointer
                  ((QArrayDataPointer<char> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
      }
    }
    else if (in_EDI == 4) {
      local_2a8 = QSurfaceFormat::version();
      local_2b8[1] = 2;
      local_2b8[0] = 1;
      std::pair<int,_int>::pair<int,_int,_true>(&local_2b0,local_2b8 + 1,local_2b8);
      bVar5 = std::operator>=((pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                              (pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      local_6d1 = 1;
      if (!bVar5) {
        QArrayDataPointer<char>::QArrayDataPointer
                  (local_2e8,(Data *)0x0,"ARB_texture_rectangle",0x15);
        QByteArray::QByteArray
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
        local_6d1 = QOpenGLContext::hasExtension(pQVar7);
      }
      local_611 = (bool)(local_6d1 & 1);
      if (!bVar5) {
        QByteArray::~QByteArray((QByteArray *)0x186086);
        QArrayDataPointer<char>::~QArrayDataPointer
                  ((QArrayDataPointer<char> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
      }
    }
    else if (in_EDI == 8) {
      local_260 = QSurfaceFormat::version();
      local_270[1] = 3;
      local_270[0] = 0;
      std::pair<int,_int>::pair<int,_int,_true>(&local_268,local_270 + 1,local_270);
      bVar5 = std::operator>=((pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                              (pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      local_6c1 = 1;
      if (!bVar5) {
        QArrayDataPointer<char>::QArrayDataPointer
                  (local_2a0,(Data *)0x0,"GL_EXT_texture_array",0x14);
        QByteArray::QByteArray
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
        local_6c1 = QOpenGLContext::hasExtension(pQVar7);
      }
      local_611 = (bool)(local_6c1 & 1);
      if (!bVar5) {
        QByteArray::~QByteArray((QByteArray *)0x185f54);
        QArrayDataPointer<char>::~QArrayDataPointer
                  ((QArrayDataPointer<char> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
      }
    }
    else if (in_EDI == 0x10) {
      local_2f0 = QSurfaceFormat::version();
      local_300[1] = 1;
      local_300[0] = 3;
      std::pair<int,_int>::pair<int,_int,_true>(&local_2f8,local_300 + 1,local_300);
      local_611 = std::operator>=((pair<int,_int> *)
                                  CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                  (pair<int,_int> *)
                                  CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
    }
    else if (in_EDI == 0x20) {
      local_218 = QSurfaceFormat::version();
      local_228[1] = 3;
      local_228[0] = 2;
      std::pair<int,_int>::pair<int,_int,_true>(&local_220,local_228 + 1,local_228);
      bVar5 = std::operator>=((pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                              (pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      local_6b1 = 1;
      if (!bVar5) {
        QArrayDataPointer<char>::QArrayDataPointer
                  (local_258,(Data *)0x0,"GL_ARB_texture_multisample",0x1a);
        QByteArray::QByteArray
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
        local_6b1 = QOpenGLContext::hasExtension(pQVar7);
      }
      local_611 = (bool)(local_6b1 & 1);
      if (!bVar5) {
        QByteArray::~QByteArray((QByteArray *)0x185e22);
        QArrayDataPointer<char>::~QArrayDataPointer
                  ((QArrayDataPointer<char> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
      }
    }
    else if (in_EDI == 0x40) {
      local_80 = QSurfaceFormat::version();
      local_90[1] = 3;
      local_90[0] = 0;
      std::pair<int,_int>::pair<int,_int,_true>(&local_88,local_90 + 1,local_90);
      bVar5 = std::operator>=((pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                              (pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      local_659 = 1;
      if (!bVar5) {
        QArrayDataPointer<char>::QArrayDataPointer
                  (local_c0,(Data *)0x0,"GL_ARB_texture_buffer_object",0x1c);
        QByteArray::QByteArray
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
        local_659 = QOpenGLContext::hasExtension(pQVar7);
      }
      local_611 = (bool)(local_659 & 1);
      if (!bVar5) {
        QByteArray::~QByteArray((QByteArray *)0x18576b);
        QArrayDataPointer<char>::~QArrayDataPointer
                  ((QArrayDataPointer<char> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
      }
    }
    else if (in_EDI == 0x80) {
      local_188 = QSurfaceFormat::version();
      local_198[1] = 4;
      local_198[0] = 0;
      std::pair<int,_int>::pair<int,_int,_true>(&local_190,local_198 + 1,local_198);
      bVar5 = std::operator>=((pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                              (pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      local_691 = 1;
      if (!bVar5) {
        QArrayDataPointer<char>::QArrayDataPointer
                  (local_1c8,(Data *)0x0,"ARB_texture_cube_map_array",0x1a);
        QByteArray::QByteArray
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
        local_691 = QOpenGLContext::hasExtension(pQVar7);
      }
      local_611 = (bool)(local_691 & 1);
      if (!bVar5) {
        QByteArray::~QByteArray((QByteArray *)0x185bbe);
        QArrayDataPointer<char>::~QArrayDataPointer
                  ((QArrayDataPointer<char> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
      }
    }
    else if (in_EDI == 0x100) {
      local_1d0 = QSurfaceFormat::version();
      local_1e0[1] = 3;
      local_1e0[0] = 3;
      std::pair<int,_int>::pair<int,_int,_true>(&local_1d8,local_1e0 + 1,local_1e0);
      bVar5 = std::operator>=((pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                              (pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      local_6a1 = 1;
      if (!bVar5) {
        QArrayDataPointer<char>::QArrayDataPointer
                  (local_210,(Data *)0x0,"GL_ARB_texture_swizzle",0x16);
        QByteArray::QByteArray
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
        local_6a1 = QOpenGLContext::hasExtension(pQVar7);
      }
      local_611 = (bool)(local_6a1 & 1);
      if (!bVar5) {
        QByteArray::~QByteArray((QByteArray *)0x185cf0);
        QArrayDataPointer<char>::~QArrayDataPointer
                  ((QArrayDataPointer<char> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
      }
    }
    else if (in_EDI == 0x200) {
      local_c8 = QSurfaceFormat::version();
      local_d8[1] = 4;
      local_d8[0] = 3;
      std::pair<int,_int>::pair<int,_int,_true>(&local_d0,local_d8 + 1,local_d8);
      bVar5 = std::operator>=((pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                              (pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      local_669 = 1;
      if (!bVar5) {
        QArrayDataPointer<char>::QArrayDataPointer
                  (local_108,(Data *)0x0,"GL_ARB_stencil_texturing",0x18);
        QByteArray::QByteArray
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
        local_669 = QOpenGLContext::hasExtension(pQVar7);
      }
      local_611 = (bool)(local_669 & 1);
      if (!bVar5) {
        QByteArray::~QByteArray((QByteArray *)0x18589d);
        QArrayDataPointer<char>::~QArrayDataPointer
                  ((QArrayDataPointer<char> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
      }
    }
    else if (in_EDI == 0x400) {
      QArrayDataPointer<char>::QArrayDataPointer
                (local_330,(Data *)0x0,"GL_EXT_texture_filter_anisotropic",0x21);
      QByteArray::QByteArray
                ((QByteArray *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                 (DataPointer *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      bVar10 = QOpenGLContext::hasExtension(pQVar7);
      local_611 = (bool)(bVar10 & 1);
      QByteArray::~QByteArray((QByteArray *)0x18617c);
      QArrayDataPointer<char>::~QArrayDataPointer
                ((QArrayDataPointer<char> *)
                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    }
    else if ((in_EDI == 0x800) || (in_EDI == 0x1000)) {
      QArrayDataPointer<char>::QArrayDataPointer
                (local_360,(Data *)0x0,"GL_ARB_texture_non_power_of_two",0x1f);
      QByteArray::QByteArray
                ((QByteArray *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                 (DataPointer *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      bVar10 = QOpenGLContext::hasExtension(pQVar7);
      local_611 = (bool)(bVar10 & 1);
      QByteArray::~QByteArray((QByteArray *)0x1861f5);
      QArrayDataPointer<char>::~QArrayDataPointer
                ((QArrayDataPointer<char> *)
                 CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
    }
    else if (in_EDI == 0x2000) {
      local_368 = QSurfaceFormat::version();
      local_378[1] = 1;
      local_378[0] = 1;
      std::pair<int,_int>::pair<int,_int,_true>(&local_370,local_378 + 1,local_378);
      local_611 = std::operator>=((pair<int,_int> *)
                                  CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                  (pair<int,_int> *)
                                  CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
    }
    else if (in_EDI == 0x4000) {
      local_380 = QSurfaceFormat::version();
      local_390[1] = 1;
      local_390[0] = 5;
      std::pair<int,_int>::pair<int,_int,_true>(&local_388,local_390 + 1,local_390);
      bVar2 = std::operator>=((pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                              (pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      bVar3 = false;
      bVar1 = false;
      bVar5 = false;
      local_6f1 = 1;
      if (!bVar2) {
        QArrayDataPointer<char>::QArrayDataPointer(local_3c0,(Data *)0x0,"GL_ARB_shadow",0xd);
        bVar3 = true;
        QByteArray::QByteArray
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
        bVar1 = true;
        uVar6 = QOpenGLContext::hasExtension(pQVar7);
        bVar5 = (uVar6 & 1) != 0;
        local_6f2 = 0;
        if (bVar5) {
          QArrayDataPointer<char>::QArrayDataPointer
                    (local_3f0,(Data *)0x0,"GL_EXT_shadow_funcs",0x13);
          QByteArray::QByteArray
                    ((QByteArray *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                     (DataPointer *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
          local_6f2 = QOpenGLContext::hasExtension(pQVar7);
        }
        local_6f1 = local_6f2;
      }
      local_611 = (bool)(local_6f1 & 1);
      if (bVar5) {
        QByteArray::~QByteArray((QByteArray *)0x186403);
        QArrayDataPointer<char>::~QArrayDataPointer
                  ((QArrayDataPointer<char> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
      }
      if (bVar1) {
        QByteArray::~QByteArray((QByteArray *)0x186435);
      }
      if (bVar3) {
        QArrayDataPointer<char>::~QArrayDataPointer
                  ((QArrayDataPointer<char> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
      }
    }
    else if (in_EDI == 0x8000) {
      local_3f8 = QSurfaceFormat::version();
      local_408[1] = 1;
      local_408[0] = 2;
      std::pair<int,_int>::pair<int,_int,_true>(&local_400,local_408 + 1,local_408);
      local_611 = std::operator>=((pair<int,_int> *)
                                  CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                  (pair<int,_int> *)
                                  CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
    }
  }
  uVar8 = QOpenGLContext::isOpenGLES();
  if ((uVar8 & 1) != 0) {
    QOpenGLContext::functions();
    __haystack = QOpenGLFunctions::glGetString
                           ((QOpenGLFunctions *)
                            CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                            in_stack_fffffffffffff89c);
    if (in_EDI == 1) {
      local_410 = QSurfaceFormat::version();
      local_420[1] = 3;
      local_420[0] = 0;
      std::pair<int,_int>::pair<int,_int,_true>(&local_418,local_420 + 1,local_420);
      bVar3 = std::operator>=((pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                              (pair<int,_int> *)
                              CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      bVar1 = false;
      bVar5 = false;
      if (bVar3) {
LAB_001866f2:
        local_611 = false;
        if (__haystack != (GLubyte *)0x0) {
          pcVar9 = strstr((char *)__haystack,"Mali");
          local_611 = pcVar9 != (char *)0x0;
        }
        local_611 = (bool)(local_611 ^ 1);
      }
      else {
        QArrayDataPointer<char>::QArrayDataPointer
                  (local_450,(Data *)0x0,"GL_EXT_texture_storage",0x16);
        bVar1 = true;
        QByteArray::QByteArray
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                   (DataPointer *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
        bVar5 = true;
        uVar6 = QOpenGLContext::hasExtension(pQVar7);
        local_611 = false;
        if ((uVar6 & 1) != 0) goto LAB_001866f2;
      }
      if (bVar5) {
        QByteArray::~QByteArray((QByteArray *)0x186752);
      }
      if (bVar1) {
        QArrayDataPointer<char>::~QArrayDataPointer
                  ((QArrayDataPointer<char> *)
                   CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
      }
    }
    else if (in_EDI == 2) {
      local_458 = QSurfaceFormat::version();
      local_468[1] = 3;
      local_468[0] = 1;
      std::pair<int,_int>::pair<int,_int,_true>(&local_460,local_468 + 1,local_468);
      local_611 = std::operator>=((pair<int,_int> *)
                                  CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                  (pair<int,_int> *)
                                  CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
    }
    else if (in_EDI != 4) {
      if (in_EDI == 8) {
        local_470 = QSurfaceFormat::version();
        local_480[1] = 3;
        local_480[0] = 0;
        std::pair<int,_int>::pair<int,_int,_true>(&local_478,local_480 + 1,local_480);
        local_611 = std::operator>=((pair<int,_int> *)
                                    CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                    (pair<int,_int> *)
                                    CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      }
      else if (in_EDI == 0x10) {
        local_488 = QSurfaceFormat::version();
        local_498[1] = 3;
        local_498[0] = 0;
        std::pair<int,_int>::pair<int,_int,_true>(&local_490,local_498 + 1,local_498);
        bVar5 = std::operator>=((pair<int,_int> *)
                                CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                (pair<int,_int> *)
                                CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
        local_71a = 1;
        if (!bVar5) {
          QArrayDataPointer<char>::QArrayDataPointer(local_4c8,(Data *)0x0,"GL_OES_texture_3D",0x11)
          ;
          QByteArray::QByteArray
                    ((QByteArray *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                     (DataPointer *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
          local_71a = QOpenGLContext::hasExtension(pQVar7);
        }
        local_611 = (bool)(local_71a & 1);
        if (!bVar5) {
          QByteArray::~QByteArray((QByteArray *)0x186950);
          QArrayDataPointer<char>::~QArrayDataPointer
                    ((QArrayDataPointer<char> *)
                     CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
        }
      }
      else if (in_EDI == 0x20) {
        local_4d0 = QSurfaceFormat::version();
        local_4e0[1] = 3;
        local_4e0[0] = 1;
        std::pair<int,_int>::pair<int,_int,_true>(&local_4d8,local_4e0 + 1,local_4e0);
        local_611 = std::operator>=((pair<int,_int> *)
                                    CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                    (pair<int,_int> *)
                                    CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      }
      else if ((in_EDI != 0x40) && (in_EDI != 0x80)) {
        if (in_EDI == 0x100) {
          local_4e8 = QSurfaceFormat::version();
          local_4f8[1] = 3;
          local_4f8[0] = 0;
          std::pair<int,_int>::pair<int,_int,_true>(&local_4f0,local_4f8 + 1,local_4f8);
          local_611 = std::operator>=((pair<int,_int> *)
                                      CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                      (pair<int,_int> *)
                                      CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898))
          ;
        }
        else if (in_EDI != 0x200) {
          if (in_EDI == 0x400) {
            QArrayDataPointer<char>::QArrayDataPointer
                      (local_528,(Data *)0x0,"GL_EXT_texture_filter_anisotropic",0x21);
            QByteArray::QByteArray
                      ((QByteArray *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                       (DataPointer *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898))
            ;
            bVar10 = QOpenGLContext::hasExtension(pQVar7);
            local_611 = (bool)(bVar10 & 1);
            QByteArray::~QByteArray((QByteArray *)0x186aba);
            QArrayDataPointer<char>::~QArrayDataPointer
                      ((QArrayDataPointer<char> *)
                       CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
          }
          else if ((in_EDI == 0x800) || (in_EDI == 0x1000)) {
            local_530 = QSurfaceFormat::version();
            local_540[1] = 3;
            local_540[0] = 0;
            std::pair<int,_int>::pair<int,_int,_true>(&local_538,local_540 + 1,local_540);
            bVar4 = std::operator>=((pair<int,_int> *)
                                    CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                    (pair<int,_int> *)
                                    CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
            bVar2 = false;
            bVar3 = false;
            bVar1 = false;
            bVar5 = false;
            local_731 = 1;
            if (!bVar4) {
              QArrayDataPointer<char>::QArrayDataPointer
                        (local_570,(Data *)0x0,"GL_OES_texture_npot",0x13);
              bVar2 = true;
              QByteArray::QByteArray
                        ((QByteArray *)CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0)
                         ,(DataPointer *)
                          CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
              bVar3 = true;
              bVar10 = QOpenGLContext::hasExtension(pQVar7);
              local_731 = 1;
              if ((bVar10 & 1) == 0) {
                QArrayDataPointer<char>::QArrayDataPointer
                          (local_5a0,(Data *)0x0,"GL_ARB_texture_non_power_of_two",0x1f);
                bVar1 = true;
                QByteArray::QByteArray
                          ((QByteArray *)
                           CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                           (DataPointer *)
                           CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
                bVar5 = true;
                local_731 = QOpenGLContext::hasExtension(pQVar7);
              }
            }
            local_611 = (bool)(local_731 & 1);
            if (bVar5) {
              QByteArray::~QByteArray((QByteArray *)0x186c53);
            }
            if (bVar1) {
              QArrayDataPointer<char>::~QArrayDataPointer
                        ((QArrayDataPointer<char> *)
                         CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
            }
            if (bVar3) {
              QByteArray::~QByteArray((QByteArray *)0x186c85);
            }
            if (bVar2) {
              QArrayDataPointer<char>::~QArrayDataPointer
                        ((QArrayDataPointer<char> *)
                         CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
            }
          }
          else if (in_EDI != 0x2000) {
            if (in_EDI == 0x4000) {
              local_5a8 = QSurfaceFormat::version();
              local_5b8[1] = 3;
              local_5b8[0] = 0;
              std::pair<int,_int>::pair<int,_int,_true>(&local_5b0,local_5b8 + 1,local_5b8);
              bVar5 = std::operator>=((pair<int,_int> *)
                                      CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                                      (pair<int,_int> *)
                                      CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898))
              ;
              bVar10 = 1;
              if (!bVar5) {
                QArrayDataPointer<char>::QArrayDataPointer
                          (local_5e8,(Data *)0x0,"GL_EXT_shadow_samplers",0x16);
                QByteArray::QByteArray
                          ((QByteArray *)
                           CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0),
                           (DataPointer *)
                           CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
                bVar10 = QOpenGLContext::hasExtension(pQVar7);
              }
              local_611 = (bool)(bVar10 & 1);
              if (!bVar5) {
                QByteArray::~QByteArray((QByteArray *)0x186dad);
                QArrayDataPointer<char>::~QArrayDataPointer
                          ((QArrayDataPointer<char> *)
                           CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
              }
            }
            else if (in_EDI == 0x8000) {
              local_5f0 = QSurfaceFormat::version();
              local_600[1] = 3;
              local_600[0] = 0;
              std::pair<int,_int>::pair<int,_int,_true>(&local_5f8,local_600 + 1,local_600);
              local_611 = std::operator>=((pair<int,_int> *)
                                          CONCAT44(in_stack_fffffffffffff8a4,
                                                   in_stack_fffffffffffff8a0),
                                          (pair<int,_int> *)
                                          CONCAT44(in_stack_fffffffffffff89c,
                                                   in_stack_fffffffffffff898));
            }
          }
        }
      }
    }
  }
  local_601 = local_611;
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_30);
LAB_00186e51:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_601;
}

Assistant:

bool QOpenGLTexture::hasFeature(Feature feature)
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    if (!ctx) {
        qWarning("QOpenGLTexture::hasFeature() requires a valid current context");
        return false;
    }

    QSurfaceFormat f = ctx->format();

    bool supported = false;

#if !QT_CONFIG(opengles2)
    if (!ctx->isOpenGLES()) {
        switch (feature) {
        case ImmutableMultisampleStorage:
            supported = f.version() >= std::pair(4, 3)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_storage_multisample"));
            break;

        case TextureBuffer:
            supported = f.version() >= std::pair(3, 0)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_buffer_object"));
            break;

        case StencilTexturing:
            supported = f.version() >= std::pair(4, 3)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_stencil_texturing"));
            break;

        case ImmutableStorage:
            supported = f.version() >= std::pair(4, 2)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_storage"))
                    || ctx->hasExtension(QByteArrayLiteral("GL_EXT_texture_storage"));
            break;

        case TextureCubeMapArrays:
            supported = f.version() >= std::pair(4, 0)
                    || ctx->hasExtension(QByteArrayLiteral("ARB_texture_cube_map_array"));
            break;

        case Swizzle:
            supported = f.version() >= std::pair(3, 3)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_swizzle"));
            break;

        case TextureMultisample:
            supported = f.version() >= std::pair(3, 2)
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_multisample"));
            break;

        case TextureArrays:
            supported = f.version() >= std::pair(3, 0)
                    || ctx->hasExtension(QByteArrayLiteral("GL_EXT_texture_array"));
            break;

        case TextureRectangle:
            supported = f.version() >= std::pair(2, 1)
                    || ctx->hasExtension(QByteArrayLiteral("ARB_texture_rectangle"));
            break;

        case Texture3D:
            supported = f.version() >= std::pair(1, 3);
            break;

        case AnisotropicFiltering:
            supported = ctx->hasExtension(QByteArrayLiteral("GL_EXT_texture_filter_anisotropic"));
            break;

        case NPOTTextures:
        case NPOTTextureRepeat:
            supported = ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_non_power_of_two"));
            break;

        case Texture1D:
            supported = f.version() >= std::pair(1, 1);
            break;

        case TextureComparisonOperators:
            // GL 1.4 and GL_ARB_shadow alone support only LEQUAL and GEQUAL;
            // since we're talking about history anyhow avoid to be extra pedantic
            // in the feature set, and simply claim supported if we have the full set of operators
            // (which has been added into 1.5 / GL_EXT_shadow_funcs).
            supported = f.version() >= std::pair(1, 5)
                    || (ctx->hasExtension(QByteArrayLiteral("GL_ARB_shadow"))
                        && ctx->hasExtension(QByteArrayLiteral("GL_EXT_shadow_funcs")));
            break;

        case TextureMipMapLevel:
            supported = f.version() >= std::pair(1, 2);
            break;

        case MaxFeatureFlag:
            break;
        }
    }

    if (ctx->isOpenGLES())
#endif
    {
        const char *renderer = reinterpret_cast<const char *>(ctx->functions()->glGetString(GL_RENDERER));
        switch (feature) {
        case ImmutableStorage:
            supported = (f.version() >= std::pair(3, 0) || ctx->hasExtension(QByteArrayLiteral("GL_EXT_texture_storage")))
                && !(renderer && strstr(renderer, "Mali")); // do not use on Mali: QTBUG-45106
            break;

        case ImmutableMultisampleStorage:
            supported = f.version() >= std::pair(3, 1);
            break;

        case TextureRectangle:
            break;

        case TextureArrays:
            supported = f.version() >= std::pair(3, 0);
            break;

        case Texture3D:
            supported = f.version() >= std::pair(3, 0)
                    || ctx->hasExtension(QByteArrayLiteral("GL_OES_texture_3D"));
            break;

        case TextureMultisample:
            supported = f.version() >= std::pair(3, 1);
            break;

        case TextureBuffer:
            break;

        case TextureCubeMapArrays:
            break;

        case Swizzle:
            supported = f.version() >= std::pair(3, 0);
            break;

        case StencilTexturing:
            break;

        case AnisotropicFiltering:
            supported = ctx->hasExtension(QByteArrayLiteral("GL_EXT_texture_filter_anisotropic"));
            break;

        case NPOTTextures:
        case NPOTTextureRepeat:
            supported = f.version() >= std::pair(3,0)
                    || ctx->hasExtension(QByteArrayLiteral("GL_OES_texture_npot"))
                    || ctx->hasExtension(QByteArrayLiteral("GL_ARB_texture_non_power_of_two"));
            break;

        case Texture1D:
            break;

        case TextureComparisonOperators:
            supported = f.version() >= std::pair(3, 0)
                    || ctx->hasExtension(QByteArrayLiteral("GL_EXT_shadow_samplers"));
            break;

        case TextureMipMapLevel:
            supported = f.version() >= std::pair(3, 0);
            break;

        case MaxFeatureFlag:
            break;
        }
    }

    return supported;
}